

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Collision_Elastic_PDU::operator==
          (Collision_Elastic_PDU *this,Collision_Elastic_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_IssuingEntityID,&Value->m_IssuingEntityID), !KVar1)) &&
      (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                         (&this->m_CollidingEntityID,&Value->m_CollidingEntityID), !KVar1)) &&
     ((KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar1
      && (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_ContactVelocity,&Value->m_ContactVelocity),
         !KVar1)))) {
    if (((float)this->m_f32Mass == (float)Value->m_f32Mass) &&
       ((!NAN((float)this->m_f32Mass) && !NAN((float)Value->m_f32Mass) &&
        (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Location,&Value->m_Location), !KVar1)))) {
      if (((float)this->m_f32CIRXX == (float)Value->m_f32CIRXX) &&
         (!NAN((float)this->m_f32CIRXX) && !NAN((float)Value->m_f32CIRXX))) {
        if (((float)this->m_f32CIRXY == (float)Value->m_f32CIRXY) &&
           (!NAN((float)this->m_f32CIRXY) && !NAN((float)Value->m_f32CIRXY))) {
          if (((float)this->m_f32CIRXZ == (float)Value->m_f32CIRXZ) &&
             (!NAN((float)this->m_f32CIRXZ) && !NAN((float)Value->m_f32CIRXZ))) {
            if (((float)this->m_f32CIRYY == (float)Value->m_f32CIRYY) &&
               (!NAN((float)this->m_f32CIRYY) && !NAN((float)Value->m_f32CIRYY))) {
              if (((float)this->m_f32CIRYZ == (float)Value->m_f32CIRYZ) &&
                 (!NAN((float)this->m_f32CIRYZ) && !NAN((float)Value->m_f32CIRYZ))) {
                if ((((float)this->m_f32CIRZZ == (float)Value->m_f32CIRZZ) &&
                    (!NAN((float)this->m_f32CIRZZ) && !NAN((float)Value->m_f32CIRZZ))) &&
                   (KVar1 = DATA_TYPE::Vector::operator!=
                                      (&this->m_UnitSurfaceNormal,&Value->m_UnitSurfaceNormal),
                   !KVar1)) {
                  return (KBOOL)(-((float)Value->m_f32COR == (float)this->m_f32COR) & 1);
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL Collision_Elastic_PDU::operator == ( const Collision_Elastic_PDU & Value ) const
{
    if( Header::operator     !=( Value ) )                   return false;
    if( m_IssuingEntityID    != Value.m_IssuingEntityID )    return false;
    if( m_CollidingEntityID  != Value.m_CollidingEntityID )  return false;
    if( m_EventID            != Value.m_EventID )            return false;
    if( m_ContactVelocity    != Value.m_ContactVelocity )    return false;
    if( m_f32Mass            != Value.m_f32Mass )            return false;
    if( m_Location           != Value.m_Location )           return false;
    if( m_f32CIRXX           != Value.m_f32CIRXX )           return false;
    if( m_f32CIRXY           != Value.m_f32CIRXY )           return false;
    if( m_f32CIRXZ           != Value.m_f32CIRXZ )           return false;
    if( m_f32CIRYY           != Value.m_f32CIRYY )           return false;
    if( m_f32CIRYZ           != Value.m_f32CIRYZ )           return false;
    if( m_f32CIRZZ           != Value.m_f32CIRZZ )           return false;
    if( m_UnitSurfaceNormal  != Value.m_UnitSurfaceNormal )  return false;
    if( m_f32COR             != Value.m_f32COR )             return false;
    return true;
}